

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilu_scopy_to_ucol.c
# Opt level: O1

int ilu_scopy_to_ucol(int jcol,int nseg,int *segrep,int *repfnz,int *perm_r,float *dense,
                     int drop_rule,milu_t milu,double drop_tol,int quota,float *sum,int *nnzUj,
                     GlobalLU_t *Glu,float *work)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  float fVar4;
  int_t iVar5;
  int_t *piVar6;
  ulong uVar7;
  long lVar8;
  void *pvVar9;
  int_t *piVar10;
  int *piVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  int *piVar18;
  int iVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  double dVar23;
  float fVar24;
  int m;
  int i_1;
  int local_c4;
  int local_c0;
  int local_bc;
  float local_b8;
  float local_b4;
  ulong local_b0;
  long local_a8;
  double local_a0;
  int *local_98;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  integer local_7c;
  int *local_78;
  int *local_70;
  float *local_68;
  int_t *local_60;
  ulong local_58;
  int_t *local_50;
  int *local_48;
  ulong local_40;
  int *local_38;
  
  local_a0 = drop_tol;
  local_98 = segrep;
  local_48 = repfnz;
  local_38 = perm_r;
  fVar20 = smach("Safe minimum");
  local_7c = 1;
  piVar18 = Glu->xsup;
  local_70 = Glu->supno;
  piVar6 = Glu->lsub;
  local_50 = Glu->xlsub;
  pvVar9 = Glu->ucol;
  piVar10 = Glu->usub;
  local_60 = Glu->xusub;
  local_c0 = Glu->nzumax;
  *sum = 0.0;
  dVar23 = local_a0;
  if (drop_rule == 0) {
    quota = Glu->n;
    dVar23 = -1.0;
  }
  fVar20 = 1.0 / fVar20;
  lVar16 = (long)jcol;
  iVar19 = local_60[lVar16];
  local_a8 = lVar16;
  if (nseg < 1) {
    fVar24 = 0.0;
  }
  else {
    local_84 = local_70[lVar16];
    uVar7 = (ulong)(uint)nseg;
    uVar14 = 0;
    fVar24 = 0.0;
    piVar11 = local_98;
    local_bc = quota;
    local_a0 = dVar23;
    local_80 = jcol;
    local_78 = piVar18;
    local_68 = dense;
    do {
      iVar1 = piVar11[uVar7 - 1];
      local_b0 = uVar14;
      local_40 = uVar7;
      if ((local_70[iVar1] != local_84) && (iVar2 = local_48[iVar1], iVar2 != -1)) {
        local_8c = (iVar2 - piVar18[local_70[iVar1]]) + local_50[piVar18[local_70[iVar1]]];
        local_58 = (ulong)(uint)(iVar1 - iVar2);
        iVar17 = iVar19 + (iVar1 - iVar2) + 1;
        local_b8 = fVar24;
        local_b4 = fVar20;
        local_88 = iVar2;
        if (local_c0 < iVar17) {
          do {
            iVar2 = local_80;
            iVar5 = sLUMemXpand(local_80,iVar19,UCOL,&local_c0,Glu);
            if (iVar5 != 0) {
              return iVar5;
            }
            pvVar9 = Glu->ucol;
            iVar5 = sLUMemXpand(iVar2,iVar19,USUB,&local_c0,Glu);
            if (iVar5 != 0) {
              return iVar5;
            }
          } while (local_c0 < iVar17);
          piVar6 = Glu->lsub;
          piVar10 = Glu->usub;
        }
        piVar11 = local_98;
        lVar16 = local_a8;
        piVar18 = local_78;
        fVar24 = local_b8;
        quota = local_bc;
        fVar20 = local_b4;
        if (-1 < (int)local_58) {
          lVar8 = 0;
          do {
            iVar2 = piVar6[local_8c + lVar8];
            fVar22 = local_68[iVar2];
            fVar21 = ABS(fVar22);
            if ((local_bc < 1) || ((double)fVar21 < local_a0)) {
              if (milu - SMILU_1 < 2) {
                fVar22 = fVar22 + *sum;
              }
              else {
                if (milu != SMILU_3) goto LAB_0010c478;
                fVar22 = *sum + fVar21;
              }
              *sum = fVar22;
            }
            else {
              fVar4 = fVar21;
              if (fVar21 <= fVar24) {
                fVar4 = fVar24;
              }
              fVar24 = fVar4;
              if (fVar20 <= fVar21) {
                fVar21 = fVar20;
              }
              fVar20 = fVar21;
              piVar10[iVar19] = local_38[iVar2];
              *(float *)((long)pvVar9 + (long)iVar19 * 4) = fVar22;
              iVar19 = iVar19 + 1;
            }
LAB_0010c478:
            local_68[iVar2] = 0.0;
            lVar8 = lVar8 + 1;
          } while ((iVar1 - local_88) + 1 != (int)lVar8);
        }
      }
      uVar7 = local_40 - 1;
      uVar13 = (int)local_b0 + 1;
      uVar14 = (ulong)uVar13;
    } while (uVar13 != nseg);
  }
  piVar6 = local_60;
  local_60[lVar16 + 1] = iVar19;
  local_c4 = iVar19 - local_60[lVar16];
  if (((drop_rule & 0xeU) != 0) && (quota < local_c4)) {
    iVar19 = local_c4 + local_60[lVar16] + -1;
    if (0 < quota) {
      if (((uint)drop_rule >> 8 & 1) == 0) {
        scopy_(&local_c4,(real *)((long)pvVar9 + (long)local_60[lVar16] * 4),&local_7c,work,
               &local_7c);
        fVar24 = sqselect(local_c4,work,quota);
        lVar16 = local_a8;
      }
      else {
        fVar24 = 1.0 / (((float)quota * (1.0 / fVar20 - 1.0 / fVar24)) / (float)local_c4 +
                       1.0 / fVar24);
      }
    }
    iVar1 = piVar6[lVar16];
    if (iVar1 <= iVar19) {
      lVar8 = (long)iVar1;
      do {
        lVar12 = (long)iVar19 << 0x20;
        lVar15 = (long)iVar19 + 1;
        while( true ) {
          fVar20 = *(float *)((long)pvVar9 + lVar8 * 4);
          fVar22 = ABS(fVar20);
          if (fVar24 < fVar22) break;
          if ((milu - SMILU_1 < 2) || (fVar20 = fVar22, milu == SMILU_3)) {
            *sum = fVar20 + *sum;
          }
          *(undefined4 *)((long)pvVar9 + lVar8 * 4) =
               *(undefined4 *)((long)pvVar9 + lVar15 * 4 + -4);
          piVar10[lVar8] = piVar10[lVar15 + -1];
          local_c4 = local_c4 + -1;
          piVar18 = piVar6 + lVar16 + 1;
          *piVar18 = *piVar18 + -1;
          lVar12 = lVar12 + -0x100000000;
          iVar19 = iVar19 + -1;
          lVar15 = lVar15 + -1;
          if (lVar15 <= lVar8) goto LAB_0010c5dc;
        }
        bVar3 = lVar8 < lVar12 >> 0x20;
        lVar8 = lVar8 + 1;
      } while (bVar3);
    }
  }
LAB_0010c5dc:
  if (milu == SMILU_2) {
    *sum = ABS(*sum);
  }
  *nnzUj = *nnzUj + local_c4;
  return 0;
}

Assistant:

int
ilu_scopy_to_ucol(
	      int	 jcol,	   /* in */
	      int	 nseg,	   /* in */
	      int	 *segrep,  /* in */
	      int	 *repfnz,  /* in */
	      int	 *perm_r,  /* in */
	      float	 *dense,   /* modified - reset to zero on return */
	      int  	 drop_rule,/* in */
	      milu_t	 milu,	   /* in */
	      double	 drop_tol, /* in */
	      int	 quota,    /* maximum nonzero entries allowed */
	      float	 *sum,	   /* out - the sum of dropped entries */
	      int	 *nnzUj,   /* in - out */
	      GlobalLU_t *Glu,	   /* modified */
	      float	 *work	   /* working space with minimum size n,
				    * used by the second dropping rule */
	      )
{
/*
 * Gather from SPA dense[*] to global ucol[*].
 */
    int       ksub, krep, ksupno, kfnz, segsze;
    int       i, k; 
    int       fsupc, isub, irow;
    int       jsupno;
    int_t     new_next, nextu, mem_error;
    int       *xsup, *supno;
    int_t     *lsub, *xlsub;
    float    *ucol;
    int_t     *usub, *xusub;
    int_t     nzumax;
    int       m; /* number of entries in the nonzero U-segments */
    register float d_max = 0.0, d_min = 1.0 / smach("Safe minimum");
    register double tmp;
    float zero = 0.0;
    int i_1 = 1;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    ucol    = (float *) Glu->ucol;
    usub    = Glu->usub;
    xusub   = Glu->xusub;
    nzumax  = Glu->nzumax;

    *sum = zero;
    if (drop_rule == NODROP) {
	drop_tol = -1.0, quota = Glu->n;
    }

    jsupno = supno[jcol];
    nextu  = xusub[jcol];
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) {
	krep = segrep[k--];
	ksupno = supno[krep];

	if ( ksupno != jsupno ) { /* Should go into ucol[] */
	    kfnz = repfnz[krep];
	    if ( kfnz != SLU_EMPTY ) {	/* Nonzero U-segment */

		fsupc = xsup[ksupno];
		isub = xlsub[fsupc] + kfnz - fsupc;
		segsze = krep - kfnz + 1;

		new_next = nextu + segsze;
		while ( new_next > nzumax ) {
		    if ((mem_error = sLUMemXpand(jcol, nextu, UCOL, &nzumax,
			    Glu)) != 0)
			return (mem_error);
		    ucol = Glu->ucol;
		    if ((mem_error = sLUMemXpand(jcol, nextu, USUB, &nzumax,
			    Glu)) != 0)
			return (mem_error);
		    usub = Glu->usub;
		    lsub = Glu->lsub;
		}

		for (i = 0; i < segsze; i++) {
		    irow = lsub[isub++];
		    tmp = fabs(dense[irow]);

		    /* first dropping rule */
		    if (quota > 0 && tmp >= drop_tol) {
			if (tmp > d_max) d_max = tmp;
			if (tmp < d_min) d_min = tmp;
			usub[nextu] = perm_r[irow];
			ucol[nextu] = dense[irow];
			nextu++;
		    } else {
			switch (milu) {
			    case SMILU_1:
			    case SMILU_2:
				*sum += dense[irow];
				break;
			    case SMILU_3:
				/* *sum += fabs(dense[irow]);*/
				*sum += tmp;
				break;
			    case SILU:
			    default:
				break;
			}
#ifdef DEBUG
			num_drop_U++;
#endif
		    }
		    dense[irow] = zero;
		}

	    }

	}

    } /* for each segment... */

    xusub[jcol + 1] = nextu;	  /* Close U[*,jcol] */
    m = xusub[jcol + 1] - xusub[jcol];

    /* second dropping rule */
    if (drop_rule & DROP_SECONDARY && m > quota) {
	register double tol = d_max;
	register int m0 = xusub[jcol] + m - 1;

	if (quota > 0) {
	    if (drop_rule & DROP_INTERP) {
		d_max = 1.0 / d_max; d_min = 1.0 / d_min;
		tol = 1.0 / (d_max + (d_min - d_max) * quota / m);
	    } else {
		scopy_(&m, &ucol[xusub[jcol]], &i_1, work, &i_1);
		tol = sqselect(m, work, quota);
#if 0
		A = &ucol[xusub[jcol]];
		for (i = 0; i < m; i++) work[i] = i;
		qsort(work, m, sizeof(int), _compare_);
		tol = fabs(usub[xusub[jcol] + work[quota]]);
#endif
	    }
	}
	for (i = xusub[jcol]; i <= m0; ) {
	    if (fabs(ucol[i]) <= tol) {
		switch (milu) {
		    case SMILU_1:
		    case SMILU_2:
			*sum += ucol[i];
			break;
		    case SMILU_3:
			*sum += fabs(ucol[i]);
			break;
		    case SILU:
		    default:
			break;
		}
		ucol[i] = ucol[m0];
		usub[i] = usub[m0];
		m0--;
		m--;
#ifdef DEBUG
		num_drop_U++;
#endif
		xusub[jcol + 1]--;
		continue;
	    }
	    i++;
	}
    }

    if (milu == SMILU_2) *sum = fabs(*sum);

    *nnzUj += m;

    return 0;
}